

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int cpu_breakpoint_remove_riscv64(CPUState *cpu,vaddr pc,int flags)

{
  CPUBreakpoint *local_30;
  CPUBreakpoint *bp;
  int flags_local;
  vaddr pc_local;
  CPUState *cpu_local;
  
  local_30 = (cpu->breakpoints).tqh_first;
  while( true ) {
    if (local_30 == (CPUBreakpoint *)0x0) {
      return -2;
    }
    if ((local_30->pc == pc) && (local_30->flags == flags)) break;
    local_30 = (local_30->entry).tqe_next;
  }
  cpu_breakpoint_remove_by_ref_riscv64(cpu,local_30);
  return 0;
}

Assistant:

int cpu_breakpoint_remove(CPUState *cpu, vaddr pc, int flags)
{
    CPUBreakpoint *bp;

    QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
        if (bp->pc == pc && bp->flags == flags) {
            cpu_breakpoint_remove_by_ref(cpu, bp);
            return 0;
        }
    }
    return -ENOENT;
}